

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::PathTypeHandlerBase::MarshalAllPropertiesToScriptContext
          (PathTypeHandlerBase *this,DynamicObject *instance,ScriptContext *targetScriptContext,
          bool invalidateFixedFields)

{
  ushort uVar1;
  ScriptContext *scriptContext;
  PropertyRecord *pPVar2;
  Var pvVar3;
  undefined7 in_register_00000009;
  uint uVar4;
  
  uVar1 = (this->super_DynamicTypeHandler).unusedBytes;
  if (((int)CONCAT71(in_register_00000009,invalidateFixedFields) != 0) && (1 < uVar1)) {
    scriptContext =
         (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
    uVar4 = 0;
    do {
      pPVar2 = TypePath::GetPropertyIdUnchecked((this->typePath).ptr,uVar4);
      InvalidateFixedFieldAt(this,pPVar2->pid,(PropertyIndex)uVar4,scriptContext);
      uVar4 = uVar4 + 1;
    } while (uVar1 >> 1 != uVar4);
  }
  if (1 < uVar1) {
    uVar4 = 0;
    do {
      pvVar3 = DynamicTypeHandler::GetSlot(&this->super_DynamicTypeHandler,instance,uVar4);
      pvVar3 = CrossSite::MarshalVar(targetScriptContext,pvVar3,false);
      DynamicTypeHandler::SetSlotUnchecked(instance,uVar4,pvVar3);
      uVar4 = uVar4 + 1;
    } while (uVar1 >> 1 != uVar4);
  }
  return;
}

Assistant:

void PathTypeHandlerBase::MarshalAllPropertiesToScriptContext(DynamicObject* instance, ScriptContext* targetScriptContext, bool invalidateFixedFields)
    {
        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.
        int propertyCount = GetPathLength();

#if ENABLE_FIXED_FIELDS
        if (invalidateFixedFields)
        {
            ScriptContext* scriptContext = instance->GetScriptContext();
            for (PropertyIndex propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
            {
                PropertyId propertyId = this->GetTypePath()->GetPropertyIdUnchecked(propertyIndex)->GetPropertyId();
                InvalidateFixedFieldAt(propertyId, propertyIndex, scriptContext);
            }
        }
#endif

        for (int slotIndex = 0; slotIndex < propertyCount; slotIndex++)
        {
            SetSlotUnchecked(instance, slotIndex, CrossSite::MarshalVar(targetScriptContext, GetSlot(instance, slotIndex)));
        }
    }